

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidgetPrivate::setVisible(QWidgetPrivate *this,bool visible)

{
  undefined8 *puVar1;
  undefined1 *puVar2;
  uint uVar3;
  uint uVar4;
  QWidget *this_00;
  long lVar5;
  QObject *pQVar6;
  QLayout *this_01;
  QDebug QVar7;
  QWidgetData *pQVar8;
  long lVar9;
  QEvent *this_02;
  QFlagsStorage<Qt::WindowState> newstate;
  Type TVar10;
  char *pcVar11;
  long *plVar12;
  uint uVar13;
  long in_FS_OFFSET;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  WidgetAttributes local_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 local_84;
  char *local_80;
  QDebug local_78;
  undefined1 local_70 [8];
  QDebug local_68;
  QDebug local_60;
  QDebug local_58;
  QWidgetData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  QtPrivateLogging::lcWidgetShowHide();
  if (((byte)QtPrivateLogging::lcWidgetShowHide::category.field_2.bools.enabledDebug._q_value.
             _M_base._M_i & 1) != 0) {
    local_98 = 2;
    uStack_94 = 0;
    uStack_90 = 0;
    uStack_8c = 0;
    uStack_88 = 0;
    local_84 = 0;
    local_80 = QtPrivateLogging::lcWidgetShowHide::category.name;
    QMessageLogger::debug();
    QVar7.stream = local_78.stream;
    QVar14.m_data = (storage_type *)0x15;
    QVar14.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar14);
    QTextStream::operator<<((QTextStream *)QVar7.stream,(QString *)local_50);
    if (local_50[0] != (QWidgetData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&local_50[0]->winid)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&local_50[0]->winid)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&local_50[0]->winid)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_50[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_78.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_78.stream,' ');
    }
    *(int *)((QTextStream *)local_78.stream + 0x28) =
         *(int *)((QTextStream *)local_78.stream + 0x28) + 1;
    ::operator<<((Stream *)&local_68,(QWidget *)local_70);
    QVar7.stream = local_68.stream;
    QVar15.m_data = (storage_type *)0xf;
    QVar15.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar15);
    QTextStream::operator<<((QTextStream *)QVar7.stream,(QString *)local_50);
    if (local_50[0] != (QWidgetData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&local_50[0]->winid)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&local_50[0]->winid)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&local_50[0]->winid)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_50[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_68.stream,' ');
    }
    *(int *)((QTextStream *)local_68.stream + 0x28) =
         *(int *)((QTextStream *)local_68.stream + 0x28) + 1;
    local_a0.widget = this_00;
    anon_unknown.dwarf_291711::operator<<
              ((anon_unknown_dwarf_291711 *)&local_58,&local_60,&local_a0);
    QVar7.stream = local_58.stream;
    QVar16.m_data = (storage_type *)0x2;
    QVar16.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar16);
    QTextStream::operator<<((QTextStream *)QVar7.stream,(QString *)local_50);
    if (local_50[0] != (QWidgetData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&local_50[0]->winid)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&local_50[0]->winid)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&local_50[0]->winid)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_50[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    pcVar11 = "false";
    if (visible) {
      pcVar11 = "true";
    }
    QTextStream::operator<<((QTextStream *)local_58.stream,pcVar11);
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QVar7.stream = local_58.stream;
    QVar17.m_data = (storage_type *)0x12;
    QVar17.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar17);
    QTextStream::operator<<((QTextStream *)QVar7.stream,(QString *)local_50);
    if (local_50[0] != (QWidgetData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&local_50[0]->winid)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&local_50[0]->winid)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&local_50[0]->winid)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_50[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QDebug::~QDebug(&local_58);
    QDebug::~QDebug(&local_60);
    QDebug::~QDebug(&local_68);
    QDebug::~QDebug((QDebug *)local_70);
    QDebug::~QDebug(&local_78);
  }
  if (!visible) {
    if (QApplicationPrivate::hidden_focus_widget == this_00) {
      QApplicationPrivate::hidden_focus_widget = (QWidget *)0x0;
    }
    pQVar8 = this_00->data;
    if ((((pQVar8->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) &&
       (lVar9 = *(long *)(*(long *)&this_00->field_0x8 + 0x10), lVar9 != 0)) {
      setDirtyOpaqueRegion(*(QWidgetPrivate **)(lVar9 + 8));
      pQVar8 = this_00->data;
    }
    if ((pQVar8->widget_attributes >> 0x10 & 1) == 0) {
      pQVar8->widget_attributes = pQVar8->widget_attributes | 0x10000;
      hide_helper(this);
      pQVar8 = this_00->data;
    }
    if ((((pQVar8->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) &&
       (pQVar6 = *(QObject **)(*(long *)&this_00->field_0x8 + 0x10), pQVar6 != (QObject *)0x0)) {
      if (*(long **)(*(long *)(pQVar6 + 8) + 0x98) == (long *)0x0) {
        if ((*(byte *)(*(long *)(pQVar6 + 0x20) + 9) & 0x80) != 0) {
          this_02 = (QEvent *)operator_new(0x10);
          QEvent::QEvent(this_02,LayoutRequest);
          QCoreApplication::postEvent(pQVar6,this_02,0);
        }
      }
      else {
        (**(code **)(**(long **)(*(long *)(pQVar6 + 8) + 0x98) + 0x70))();
      }
    }
    TVar10 = HideToParent;
    goto LAB_0030a069;
  }
  pQVar8 = this_00->data;
  if ((((((pQVar8->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) &&
       (lVar9 = *(long *)(*(long *)&this_00->field_0x8 + 0x10), lVar9 != 0)) &&
      ((*(byte *)(*(long *)(lVar9 + 0x20) + 9) & 0x80) != 0)) &&
     ((*(byte *)(*(long *)(lVar9 + 8) + 0x243) & 0x10) == 0)) {
    do {
      puVar1 = (undefined8 *)(lVar9 + 8);
      lVar5 = *(long *)&((QWidgetPrivate *)*puVar1)->field_0x10;
      if (lVar5 == 0) break;
      plVar12 = (long *)(lVar9 + 0x20);
      lVar9 = lVar5;
    } while ((*(uint *)(*plVar12 + 0xc) & 1) == 0);
    createRecursively((QWidgetPrivate *)*puVar1);
    pQVar8 = this_00->data;
  }
  uVar13 = *(uint *)(*(long *)&this_00->field_0x8 + 0x240);
  if (((uVar13 >> 0x1c & 1) == 0) &&
     ((((pQVar8->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
        super_QFlagsStorage<Qt::WindowType>.i & 1) != 0 ||
      ((*(byte *)(*(long *)(*(long *)(*(long *)&this_00->field_0x8 + 0x10) + 8) + 0x243) & 0x10) !=
       0)))) {
    QWidget::create(this_00,0,false,false);
    pQVar8 = this_00->data;
    uVar13 = *(uint *)(*(long *)&this_00->field_0x8 + 0x240);
  }
  uVar3 = *(uint *)&pQVar8->field_0x10;
  QWidget::ensurePolished(this_00);
  pQVar8 = this_00->data;
  uVar4 = pQVar8->widget_attributes;
  if (((pQVar8->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
    if ((uVar4 >> 0x10 & 1) != 0) {
      pQVar8->widget_attributes = uVar4 & 0xfffeffff;
      updateGeometry_helper(this,true);
    }
  }
  else if ((uVar4 >> 0x10 & 1) != 0) {
    pQVar8->widget_attributes = uVar4 & 0xfffeffff;
  }
  if (this->layout != (QLayout *)0x0) {
    QLayout::activate(this->layout);
  }
  puVar2 = &this_00->field_0x8;
  plVar12 = (long *)puVar2;
  if (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
    do {
      lVar9 = *(long *)(*plVar12 + 0x10);
      if (lVar9 == 0) goto LAB_00309f44;
      if ((((*(byte *)(*(long *)(lVar9 + 0x20) + 9) & 0x80) == 0) ||
          (this_01 = *(QLayout **)(*(long *)(lVar9 + 8) + 0x98), this_01 == (QLayout *)0x0)) ||
         ((*(byte *)(*(long *)(lVar9 + 0x20) + 0x11) & 4) != 0)) break;
      QLayout::activate(this_01);
      plVar12 = (long *)(lVar9 + 8);
    } while ((*(byte *)(*(long *)(lVar9 + 0x20) + 0xc) & 1) == 0);
    setDirtyOpaqueRegion(*(QWidgetPrivate **)(lVar9 + 8));
  }
LAB_00309f44:
  if ((uVar13 >> 10 & 1) == 0) {
    if (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
      lVar9 = *(long *)puVar2;
      if (*(long *)(*(long *)(*(long *)(lVar9 + 0x10) + 8) + 0x98) != 0) goto LAB_00309fb7;
      QWidget::adjustSize(this_00);
    }
    else {
      newstate.i = uVar3 & 0xf;
      QWidget::adjustSize(this_00);
      if ((*(uint *)&this_00->data->field_0x10 & 0xf) != newstate.i) {
        QWidget::setWindowState(this_00,(WindowStates)newstate.i);
      }
    }
    lVar9 = *(long *)puVar2;
    if ((*(uint *)(lVar9 + 0x240) >> 10 & 1) != 0) {
      *(uint *)(lVar9 + 0x240) = *(uint *)(lVar9 + 0x240) & 0xfffffbff;
    }
  }
  else {
    lVar9 = *(long *)puVar2;
  }
LAB_00309fb7:
  if ((*(uint *)(lVar9 + 0x244) >> 0xd & 1) != 0) {
    *(uint *)(lVar9 + 0x244) = *(uint *)(lVar9 + 0x244) & 0xffffdfff;
  }
  if ((((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
        super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) ||
     ((*(byte *)(*(long *)(*(long *)(lVar9 + 0x10) + 0x20) + 9) & 0x80) != 0)) {
    show_helper(this);
    QApplicationPrivate::sendSyntheticEnterLeave
              (*(QApplicationPrivate **)(QCoreApplication::self + 8),this_00);
  }
  TVar10 = ShowToParent;
LAB_0030a069:
  uStack_8c = 0xaaaaaaaa;
  uStack_90 = 0xaaaaaaaa;
  uStack_94 = 0xaaaaaaaa;
  local_98 = 0xaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_98,TVar10);
  QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)&local_98);
  QEvent::~QEvent((QEvent *)&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::setVisible(bool visible)
{
    Q_Q(QWidget);
    qCDebug(lcWidgetShowHide) << "Setting visibility of" << q
                              << "with attributes" << WidgetAttributes{q}
                              << "to" << visible << "via QWidgetPrivate";

    if (visible) { // show
        // Designer uses a trick to make grabWidget work without showing
        if (!q->isWindow() && q->parentWidget() && q->parentWidget()->isVisible()
            && !q->parentWidget()->testAttribute(Qt::WA_WState_Created))
            q->parentWidget()->window()->d_func()->createRecursively();

        //create toplevels but not children of non-visible parents
        QWidget *pw = q->parentWidget();
        if (!q->testAttribute(Qt::WA_WState_Created)
            && (q->isWindow() || pw->testAttribute(Qt::WA_WState_Created))) {
            q->create();
        }

        bool wasResized = q->testAttribute(Qt::WA_Resized);
        Qt::WindowStates initialWindowState = q->windowState();

        // polish if necessary
        q->ensurePolished();

        // whether we need to inform the parent widget immediately
        bool needUpdateGeometry = !q->isWindow() && q->testAttribute(Qt::WA_WState_Hidden);
        // we are no longer hidden
        q->setAttribute(Qt::WA_WState_Hidden, false);

        if (needUpdateGeometry)
            updateGeometry_helper(true);

        // activate our layout before we and our children become visible
        if (layout)
            layout->activate();

        if (!q->isWindow()) {
            QWidget *parent = q->parentWidget();
            while (parent && parent->isVisible() && parent->d_func()->layout  && !parent->data->in_show) {
                parent->d_func()->layout->activate();
                if (parent->isWindow())
                    break;
                parent = parent->parentWidget();
            }
            if (parent)
                parent->d_func()->setDirtyOpaqueRegion();
        }

        // adjust size if necessary
        if (!wasResized
            && (q->isWindow() || !q->parentWidget()->d_func()->layout))  {
            if (q->isWindow()) {
                q->adjustSize();
                if (q->windowState() != initialWindowState)
                    q->setWindowState(initialWindowState);
            } else {
                q->adjustSize();
            }
            q->setAttribute(Qt::WA_Resized, false);
        }

        q->setAttribute(Qt::WA_KeyboardFocusChange, false);

        if (q->isWindow() || q->parentWidget()->isVisible()) {
            show_helper();

            qApp->d_func()->sendSyntheticEnterLeave(q);
        }

        QEvent showToParentEvent(QEvent::ShowToParent);
        QCoreApplication::sendEvent(q, &showToParentEvent);
    } else { // hide
        if (QApplicationPrivate::hidden_focus_widget == q)
            QApplicationPrivate::hidden_focus_widget = nullptr;

        // hw: The test on getOpaqueRegion() needs to be more intelligent
        // currently it doesn't work if the widget is hidden (the region will
        // be clipped). The real check should be testing the cached region
        // (and dirty flag) directly.
        if (!q->isWindow() && q->parentWidget()) // && !d->getOpaqueRegion().isEmpty())
            q->parentWidget()->d_func()->setDirtyOpaqueRegion();

        if (!q->testAttribute(Qt::WA_WState_Hidden)) {
            q->setAttribute(Qt::WA_WState_Hidden);
            hide_helper();
        }

        // invalidate layout similar to updateGeometry()
        if (!q->isWindow() && q->parentWidget()) {
            if (q->parentWidget()->d_func()->layout)
                q->parentWidget()->d_func()->layout->invalidate();
            else if (q->parentWidget()->isVisible())
                QCoreApplication::postEvent(q->parentWidget(), new QEvent(QEvent::LayoutRequest));
        }

        QEvent hideToParentEvent(QEvent::HideToParent);
        QCoreApplication::sendEvent(q, &hideToParentEvent);
    }
}